

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompositionfunctions.cpp
# Opt level: O3

void comp_func_solid_SourceOver(uint *dest,int length,uint color,uint const_alpha)

{
  ulong uVar1;
  ulong uVar2;
  
  if (const_alpha == 0xff) {
    if (0xfeffffff < color) {
      (*qt_memfill32)(dest,color,(long)length);
      return;
    }
  }
  else {
    uVar1 = (ulong)(byte)const_alpha * (((ulong)color << 0x18 | (ulong)color) & 0xff00ff00ff00ff);
    uVar1 = uVar1 + 0x80008000800080 + (uVar1 >> 8 & 0xff00ff00ff00ff) >> 8 & 0xff00ff00ff00ff;
    color = (uint)(uVar1 >> 0x18) | (uint)uVar1;
  }
  if (0 < length) {
    uVar1 = 0;
    do {
      uVar2 = (((ulong)dest[uVar1] << 0x18 | (ulong)dest[uVar1]) & 0xff00ff00ff00ff) *
              (ulong)(~color >> 0x18);
      uVar2 = uVar2 + 0x80008000800080 + (uVar2 >> 8 & 0xff00ff00ff00ff) >> 8 & 0xff00ff00ff00ff;
      dest[uVar1] = ((uint)(uVar2 >> 0x18) | (uint)uVar2) + color;
      uVar1 = uVar1 + 1;
    } while ((uint)length != uVar1);
  }
  return;
}

Assistant:

void QT_FASTCALL comp_func_solid_SourceOver(uint *dest, int length, uint color, uint const_alpha)
{
    comp_func_solid_SourceOver_template<Argb32Operations>(dest, length, color, const_alpha);
}